

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManComputeDistance(Gia_Man_t *p,int iObj,Vec_Int_t *vObjs,int fVerbose)

{
  Vec_Int_t *pVVar1;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    pVVar1 = Gia_ManComputeDistanceInt(p,iObj,vObjs,fVerbose);
    return pVVar1;
  }
  Gia_ManStaticFanoutStart(p);
  pVVar1 = Gia_ManComputeDistanceInt(p,iObj,vObjs,fVerbose);
  Gia_ManStaticFanoutStop(p);
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_ManComputeDistance( Gia_Man_t * p, int iObj, Vec_Int_t * vObjs, int fVerbose )
{
    Vec_Int_t * vDists;
    if ( p->vFanoutNums )
        vDists = Gia_ManComputeDistanceInt( p, iObj, vObjs, fVerbose );
    else
    {
        Gia_ManStaticFanoutStart( p );
        vDists = Gia_ManComputeDistanceInt( p, iObj, vObjs, fVerbose );
        Gia_ManStaticFanoutStop( p );
    }
    return vDists;
}